

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_init_cache(randomx_cache *cache,void *key,size_t keySize)

{
  bool bVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  string cacheKey;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  string *this;
  string local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  this = local_38;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(this);
  std::__cxx11::string::assign((char *)this,local_10);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if ((bVar1) || (bVar1 = randomx_cache::isInitialized((randomx_cache *)0x13192c), !bVar1)) {
    (**(code **)(local_8 + 0x18))(local_8,local_10,local_18);
    std::__cxx11::string::operator=((string *)(local_8 + 0x8380),local_38);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void randomx_init_cache(randomx_cache *cache, const void *key, size_t keySize) {
		assert(cache != nullptr);
		assert(keySize == 0 || key != nullptr);
		std::string cacheKey;
		cacheKey.assign((const char *)key, keySize);
		if (cache->cacheKey != cacheKey || !cache->isInitialized()) {
			cache->initialize(cache, key, keySize);
			cache->cacheKey = cacheKey;
		}
	}